

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O2

string * compute_crc(string *__return_storage_ptr__,string *msg)

{
  size_type sVar1;
  int i;
  ulong uVar2;
  allocator local_61;
  string m;
  string crc;
  
  std::operator+(&m,msg,"0000000000000000");
  std::__cxx11::string::string((string *)&crc,"10000000000000101",&local_61);
  sVar1 = m._M_string_length;
  for (uVar2 = 0; uVar2 < sVar1 - 0x10; uVar2 = uVar2 + 1) {
    if (m._M_dataplus._M_p[uVar2] != '0') {
      string_xor((iterator)(m._M_dataplus._M_p + uVar2),(iterator)crc._M_dataplus._M_p,0x11);
      sVar1 = m._M_string_length;
    }
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&m);
  std::__cxx11::string::~string((string *)&crc);
  std::__cxx11::string::~string((string *)&m);
  return __return_storage_ptr__;
}

Assistant:

string compute_crc(string msg) {
//	string m = msg + "000";
//	string crc = "1011";
	string m = msg + "0000000000000000";
	string crc = "10000000000000101";
	int len = m.length();

	for (int i = 0; i < m.length() - 16; ++i) {
		if(m[i] == '0') continue;
		/* cout << m << endl; */
		string_xor(m.begin() + i, crc.begin(), 17);
	}
	/* cout << "final\n"; */
//	cout <<  m << endl;
	return m.substr(len - 16, 16);
}